

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::~IfcEdgeCurve(IfcEdgeCurve *this)

{
  char *pcVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  pcVar1 = (this->SameSense).field_2._M_local_buf + (long)p_Var2;
  pcVar1[-0x68] = -0x20;
  pcVar1[-0x67] = -0x17;
  pcVar1[-0x66] = -0x7d;
  pcVar1[-0x65] = '\0';
  pcVar1[-100] = '\0';
  pcVar1[-99] = '\0';
  pcVar1[-0x62] = '\0';
  pcVar1[-0x61] = '\0';
  pcVar1[0x10] = -0x80;
  pcVar1[0x11] = -0x16;
  pcVar1[0x12] = -0x7d;
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[-0x58] = '\b';
  pcVar1[-0x57] = -0x16;
  pcVar1[-0x56] = -0x7d;
  pcVar1[-0x55] = '\0';
  pcVar1[-0x54] = '\0';
  pcVar1[-0x53] = '\0';
  pcVar1[-0x52] = '\0';
  pcVar1[-0x51] = '\0';
  pcVar1[-0x48] = '0';
  pcVar1[-0x47] = -0x16;
  pcVar1[-0x46] = -0x7d;
  pcVar1[-0x45] = '\0';
  pcVar1[-0x44] = '\0';
  pcVar1[-0x43] = '\0';
  pcVar1[-0x42] = '\0';
  pcVar1[-0x41] = '\0';
  pcVar1[-0x28] = 'X';
  pcVar1[-0x27] = -0x16;
  pcVar1[-0x26] = -0x7d;
  pcVar1[-0x25] = '\0';
  pcVar1[-0x24] = '\0';
  pcVar1[-0x23] = '\0';
  pcVar1[-0x22] = '\0';
  pcVar1[-0x21] = '\0';
  if (*(char **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(char **)(pcVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}